

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoogleTestApprovals.h
# Opt level: O3

void __thiscall
ApprovalTests::GoogleTestListener::OnTestStart(GoogleTestListener *this,TestInfo *testInfo)

{
  TestName *this_00;
  pointer pcVar1;
  bool bVar2;
  string *psVar3;
  allocator local_b9;
  string local_b8;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  string local_70;
  string local_50;
  
  ::std::__cxx11::string::string
            ((string *)&local_b8,(testInfo->location_).file._M_dataplus._M_p,&local_b9);
  this_00 = &this->currentTest;
  TestName::setFileName(this_00,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,0,0);
  psVar3 = TestName::getFileName_abi_cxx11_(this_00);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + psVar3->_M_string_length);
  ::std::__cxx11::string::string
            ((string *)&local_50,(testInfo->test_case_name_)._M_dataplus._M_p,(allocator *)&local_b8
            );
  bVar2 = isDuplicate(this,&local_70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (!bVar2) {
    local_b8._M_dataplus._M_p = (testInfo->test_case_name_)._M_dataplus._M_p;
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char **)&local_b8);
  }
  ::std::__cxx11::string::string((string *)&local_b8,(testInfo->name_)._M_dataplus._M_p,&local_b9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_b8._M_string_length != 0) {
    local_b8._M_dataplus._M_p = (testInfo->name_)._M_dataplus._M_p;
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char **)&local_b8);
  }
  FrameworkIntegrations::setCurrentTest(this_00);
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_80 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/google/GoogleTestApprovals.h:51:17)>
             ::_M_invoke;
  local_88 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/google/GoogleTestApprovals.h:51:17)>
             ::_M_manager;
  FrameworkIntegrations::setTestPassedNotification((TestPassedNotification *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  return;
}

Assistant:

virtual void OnTestStart(const testing::TestInfo& testInfo) override
        {
            currentTest.setFileName(testInfo.file());
            currentTest.sections = {};
            if (!isDuplicate(currentTest.getFileName(), testInfo.test_case_name()))
            {
                currentTest.sections.emplace_back(testInfo.test_case_name());
            }
            if (!std::string(testInfo.name()).empty())
            {
                currentTest.sections.emplace_back(testInfo.name());
            }

            ApprovalTests::FrameworkIntegrations::setCurrentTest(&currentTest);
            ApprovalTests::FrameworkIntegrations::setTestPassedNotification(
                []() { EXPECT_TRUE(true); });
        }